

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

int __thiscall MatchTable::match(MatchTable *this,char *txt)

{
  pointer pMVar1;
  int *piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  pointer piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  pointer piVar8;
  char cVar9;
  pointer pMVar10;
  long lVar11;
  ulong uVar12;
  int state;
  vector<int,_std::allocator<int>_> curr_vec;
  allocator_type local_4d;
  value_type_conflict1 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_4c = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_4c,&local_4d);
  cVar9 = *txt;
  if (cVar9 != '\0') {
    lVar5 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    pMVar1 = (this->tools).super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar11 = 0;
        pMVar10 = pMVar1;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] =
               *(int *)(*(long *)(*(long *)&(pMVar10->dtran).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl +
                                 (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar11] * 0x18) +
                       (long)cVar9 * 4);
          lVar11 = lVar11 + 1;
          pMVar10 = pMVar10 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar11);
      }
      cVar9 = txt[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (cVar9 != '\0');
  }
  iVar6 = -1;
  piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar5 = 8;
    uVar12 = 0;
    piVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      local_4c = piVar8[uVar12];
      if ((local_4c != 0) &&
         (pMVar1 = (this->tools).super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
                   super__Vector_impl_data._M_start,
         piVar2 = *(int **)((long)&(pMVar1->dtran).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl + lVar5 * 4),
         _Var3 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (*(undefined8 *)((long)pMVar1 + lVar5 * 4 + -8),piVar2,&local_4c),
         piVar4 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
         piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start, _Var3._M_current != piVar2)) {
        iVar6 = (int)uVar12;
        break;
      }
      uVar12 = uVar12 + 1;
      lVar5 = lVar5 + 0xc;
    } while (uVar12 < (ulong)((long)piVar4 - (long)piVar8 >> 2));
  }
  if (piVar8 != (pointer)0x0) {
    operator_delete(piVar8,(long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar8);
  }
  return iVar6;
}

Assistant:

int MatchTable::match(const char *txt) const {
    std::vector<int> curr_vec(regs.size(), 1);
    for (int i = 0; txt[i] != '\0'; i++) {
        int ch = (int)txt[i];
        for (int j = 0; j < curr_vec.size(); j++) {
            curr_vec[j] = tools[j].dtran[curr_vec[j]][ch];
        }
    }
    for (int i = 0; i < curr_vec.size(); i++) {
        int state = curr_vec[i];
        if (state == 0) continue;
        std::vector<int>::const_iterator first = tools[i].targets.cbegin(),
                f,
                last = tools[i].targets.cend();
        if ((f = std::find(first, last, state)) != last) {
            return i;
        }
    }
    return -1;
}